

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::generatePluginMetaData(Generator *this)

{
  ClassDef *pCVar1;
  FILE *__stream;
  qsizetype qVar2;
  qsizetype qVar3;
  char *pcVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QArrayDataPointer<char> QStack_58;
  anon_class_8_1_8991fb9c local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = this->cdef;
  if ((pCVar1->pluginData).iid.d.size != 0) {
    local_40.this = this;
    qVar2 = QByteArrayView::lengthHelperCharArray("::",3);
    bv.m_data = "::";
    bv.m_size = qVar2;
    for (qVar2 = QByteArray::indexOf(&(pCVar1->super_BaseDef).qualified,bv,0);
        __stream = (FILE *)this->out, qVar2 != -1;
        qVar2 = QByteArray::indexOf(&(pCVar1->super_BaseDef).qualified,bv_00,qVar2 + 2)) {
      QByteArray::left((QByteArray *)&QStack_58,&(this->cdef->super_BaseDef).qualified,qVar2);
      pcVar5 = QStack_58.ptr;
      if (QStack_58.ptr == (char *)0x0) {
        pcVar5 = (char *)&QByteArray::_empty;
      }
      fprintf(__stream,"using namespace %s;\n",pcVar5);
      QArrayDataPointer<char>::~QArrayDataPointer(&QStack_58);
      pCVar1 = this->cdef;
      qVar3 = QByteArrayView::lengthHelperCharArray("::",3);
      bv_00.m_data = "::";
      bv_00.m_size = qVar3;
    }
    fputs("\n#ifdef QT_MOC_EXPORT_PLUGIN_V2",__stream);
    pcVar5 = (this->cdef->super_BaseDef).classname.d.ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"\nstatic constexpr unsigned char qt_pluginMetaDataV2_%s[] = {",pcVar5
           );
    generatePluginMetaData::anon_class_8_1_8991fb9c::operator()(&local_40);
    pcVar5 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    pcVar4 = (this->cdef->super_BaseDef).classname.d.ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"\n};\nQT_MOC_EXPORT_PLUGIN_V2(%s, %s, qt_pluginMetaDataV2_%s)\n",
            pcVar5,pcVar4,pcVar4);
    pcVar5 = (this->cdef->super_BaseDef).classname.d.ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "#else\nQT_PLUGIN_METADATA_SECTION\nQ_CONSTINIT static constexpr unsigned char qt_pluginMetaData_%s[] = {\n    \'Q\', \'T\', \'M\', \'E\', \'T\', \'A\', \'D\', \'A\', \'T\', \'A\', \' \', \'!\',\n    // metadata version, Qt version, architectural requirements\n    0, QT_VERSION_MAJOR, QT_VERSION_MINOR, qPluginArchRequirements(),"
            ,pcVar5);
    generatePluginMetaData::anon_class_8_1_8991fb9c::operator()(&local_40);
    pcVar5 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    pcVar4 = (this->cdef->super_BaseDef).classname.d.ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "\n};\nQT_MOC_EXPORT_PLUGIN(%s, %s)\n#endif  // QT_MOC_EXPORT_PLUGIN_V2\n",pcVar5,pcVar4
           );
    fputs("\n",(FILE *)this->out);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::generatePluginMetaData()
{
    if (cdef->pluginData.iid.isEmpty())
        return;

    auto outputCborData = [this]() {
        CborDevice dev(out);
        CborEncoder enc;
        cbor_encoder_init_writer(&enc, CborDevice::callback, &dev);

        CborEncoder map;
        cbor_encoder_create_map(&enc, &map, CborIndefiniteLength);

        dev.nextItem("\"IID\"");
        cbor_encode_int(&map, int(QtPluginMetaDataKeys::IID));
        cbor_encode_text_string(&map, cdef->pluginData.iid.constData(), cdef->pluginData.iid.size());

        dev.nextItem("\"className\"");
        cbor_encode_int(&map, int(QtPluginMetaDataKeys::ClassName));
        cbor_encode_text_string(&map, cdef->classname.constData(), cdef->classname.size());

        QJsonObject o = cdef->pluginData.metaData.object();
        if (!o.isEmpty()) {
            dev.nextItem("\"MetaData\"");
            cbor_encode_int(&map, int(QtPluginMetaDataKeys::MetaData));
            jsonObjectToCbor(&map, o);
        }

        if (!cdef->pluginData.uri.isEmpty()) {
            dev.nextItem("\"URI\"");
            cbor_encode_int(&map, int(QtPluginMetaDataKeys::URI));
            cbor_encode_text_string(&map, cdef->pluginData.uri.constData(), cdef->pluginData.uri.size());
        }

        // Add -M args from the command line:
        for (auto it = cdef->pluginData.metaArgs.cbegin(), end = cdef->pluginData.metaArgs.cend(); it != end; ++it) {
            const QJsonArray &a = it.value();
            QByteArray key = it.key().toUtf8();
            dev.nextItem(QByteArray("command-line \"" + key + "\"").constData());
            cbor_encode_text_string(&map, key.constData(), key.size());
            jsonArrayToCbor(&map, a);
        }

        // Close the CBOR map manually
        dev.nextItem();
        cbor_encoder_close_container(&enc, &map);
    };

    // 'Use' all namespaces.
    qsizetype pos = cdef->qualified.indexOf("::");
    for ( ; pos != -1 ; pos = cdef->qualified.indexOf("::", pos + 2) )
        fprintf(out, "using namespace %s;\n", cdef->qualified.left(pos).constData());

    fputs("\n#ifdef QT_MOC_EXPORT_PLUGIN_V2", out);

    // Qt 6.3+ output
    fprintf(out, "\nstatic constexpr unsigned char qt_pluginMetaDataV2_%s[] = {",
          cdef->classname.constData());
    outputCborData();
    fprintf(out, "\n};\nQT_MOC_EXPORT_PLUGIN_V2(%s, %s, qt_pluginMetaDataV2_%s)\n",
            cdef->qualified.constData(), cdef->classname.constData(), cdef->classname.constData());

    // compatibility with Qt 6.0-6.2
    fprintf(out, "#else\nQT_PLUGIN_METADATA_SECTION\n"
          "Q_CONSTINIT static constexpr unsigned char qt_pluginMetaData_%s[] = {\n"
          "    'Q', 'T', 'M', 'E', 'T', 'A', 'D', 'A', 'T', 'A', ' ', '!',\n"
          "    // metadata version, Qt version, architectural requirements\n"
          "    0, QT_VERSION_MAJOR, QT_VERSION_MINOR, qPluginArchRequirements(),",
          cdef->classname.constData());
    outputCborData();
    fprintf(out, "\n};\nQT_MOC_EXPORT_PLUGIN(%s, %s)\n"
                 "#endif  // QT_MOC_EXPORT_PLUGIN_V2\n",
            cdef->qualified.constData(), cdef->classname.constData());

    fputs("\n", out);
}